

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNRPL.cpp
# Opt level: O2

bool __thiscall NaNNRegrPlantLearn::user_break(NaNNRegrPlantLearn *this)

{
  return false;
}

Assistant:

bool
NaNNRegrPlantLearn::user_break ()
{
#if defined(__MSDOS__) || (defined(__WIN32__) && !defined(__MINGW32__))
    if(kbhit()){
        int c = getch();
        if('x' == c || 'q' == c){
            return true;
        }
    }
#endif /* DOS & Win */
    return false;
}